

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.cc
# Opt level: O0

void __thiscall iqxmlrpc::Print_value_visitor::do_visit_struct(Print_value_visitor *this,Struct *s)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_28;
  _Self local_20;
  CI i;
  Struct *s_local;
  Print_value_visitor *this_local;
  
  i._M_node = (_Base_ptr)s;
  std::operator<<(this->out_,"{");
  local_20._M_node = (_Base_ptr)Struct::begin_abi_cxx11_(i._M_node);
  while( true ) {
    local_28._M_node = (_Base_ptr)Struct::end_abi_cxx11_(i._M_node);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    poVar2 = std::operator<<(this->out_," \'");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
             ::operator->(&local_20);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    std::operator<<(poVar2,"\' => ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
             ::operator->(&local_20);
    Value::apply_visitor(ppVar3->second,&this->super_Value_type_visitor);
    std::operator<<(this->out_,",");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
    ::operator++(&local_20);
  }
  std::operator<<(this->out_," }");
  return;
}

Assistant:

void Print_value_visitor::do_visit_struct(const Struct& s)
{
  out_ << "{";

  typedef Struct::const_iterator CI;
  for(CI i = s.begin(); i != s.end(); ++i )
  {
    out_ << " '" << i->first << "' => ";
    i->second->apply_visitor(*this);
    out_ << ",";
  }

  out_ << " }";
}